

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::GetAmpEnable(AmpIO *this,uint index)

{
  uint32_t uVar1;
  quadlet_t *pqVar2;
  uint uVar3;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    pqVar2 = this->ReadBuffer + (this->MOTOR_STATUS_OFFSET + index);
    if (uVar1 < 8) {
      pqVar2 = this->ReadBuffer + 1;
    }
    uVar3 = 0x10000000;
    if (uVar1 < 8) {
      uVar3 = 1 << ((byte)index & 0x1f);
    }
    return (*pqVar2 & uVar3) != 0;
  }
  return false;
}

Assistant:

bool AmpIO::GetAmpEnable(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret;
    if (GetFirmwareVersion() < 8) {
        uint32_t mask = (0x00000001 << index);
        ret = GetStatus()&mask;
    }
    else {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_AMP_REQ;
    }
    return ret;
}